

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void filter_vert(uint8_t *dst,int dst_stride,AV1_DEBLOCKING_PARAMETERS *params,
                SequenceHeader *seq_params,USE_FILTER_TYPE use_filter_type)

{
  uint8_t *puVar1;
  uint16_t *puVar2;
  long in_RCX;
  uint8_t *in_RDX;
  undefined8 unaff_RBX;
  int in_ESI;
  uint8_t *in_RDI;
  char in_R8B;
  uint8_t *unaff_retaddr;
  uint16_t *dst_shortptr;
  aom_bit_depth_t bit_depth;
  int use_highbitdepth;
  loop_filter_thresh *limits;
  int in_stack_00000094;
  uint8_t *in_stack_00000098;
  uint8_t *in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  int in_stack_000000b4;
  uint16_t *in_stack_000000b8;
  uint8_t *in_stack_000000c0;
  uint8_t *in_stack_000000c8;
  int in_stack_000000d4;
  uint8_t *in_stack_000000d8;
  uchar *in_stack_00000108;
  undefined4 in_stack_00000110;
  int in_stack_00000114;
  uchar *in_stack_00000118;
  undefined4 in_stack_00000120;
  int in_stack_00000124;
  uchar *in_stack_00000128;
  undefined4 in_stack_00000130;
  int in_stack_00000134;
  uint16_t *in_stack_00000138;
  undefined4 in_stack_00000140;
  int in_stack_00000144;
  uint16_t *in_stack_00000148;
  uint8_t *in_stack_00000150;
  uint8_t *in_stack_00000158;
  undefined4 in_stack_00000160;
  int in_stack_00000164;
  undefined4 in_stack_00000168;
  int in_stack_0000016c;
  uchar *in_stack_00000170;
  uint8_t *in_stack_00000178;
  undefined4 in_stack_00000180;
  int in_stack_00000184;
  uint8_t *in_stack_00000188;
  undefined4 in_stack_00000190;
  int in_stack_00000194;
  uint8_t *in_stack_00000198;
  uint8_t *in_stack_000001a0;
  uint8_t *in_stack_000001a8;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  int in_stack_0000023c;
  uint8_t *in_stack_00000240;
  uint8_t *in_stack_00000248;
  uint8_t *in_stack_00000250;
  int in_stack_0000025c;
  uint16_t *in_stack_00000260;
  uint8_t *in_stack_000002d0;
  uint8_t *in_stack_000002d8;
  uint8_t *in_stack_000002e0;
  uint8_t *in_stack_000002e8;
  int in_stack_000002f4;
  uchar *in_stack_000002f8;
  uint8_t *in_stack_00000ba0;
  uint8_t *in_stack_00000ba8;
  uint8_t *in_stack_000010f0;
  uint8_t *in_stack_000010f8;
  int in_stack_00001100;
  uint8_t *in_stack_00001320;
  uint8_t *in_stack_00001328;
  uint8_t *in_stack_00001780;
  uint8_t *in_stack_00001788;
  uint8_t *in_stack_00002920;
  uint8_t *in_stack_00002928;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  puVar1 = *(uint8_t **)(in_RDX + 8);
  iVar3 = *(int *)(in_RCX + 0x48);
  if (*(char *)(in_RCX + 0x4c) == '\0') {
    if (in_R8B == '\x02') {
      iVar3 = (int)((ulong)unaff_RBX >> 0x20);
      switch(*in_RDX) {
      case '\x04':
        aom_lpf_vertical_4_quad_sse2
                  (unaff_retaddr,iVar3,in_RDI,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                   in_RDX);
        break;
      default:
        break;
      case '\x06':
        aom_lpf_vertical_6_quad_sse2
                  (unaff_retaddr,iVar3,in_RDI,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                   in_RDX);
        break;
      case '\b':
        aom_lpf_vertical_8_quad_sse2
                  (unaff_retaddr,iVar3,in_RDI,(uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                   in_RDX);
        break;
      case '\x0e':
        (*aom_lpf_vertical_14_quad)(in_RDI,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20);
      }
    }
    else if (in_R8B == '\x01') {
      switch(*in_RDX) {
      case '\x04':
        aom_lpf_vertical_4_dual_sse2
                  (in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,in_stack_000001a0,
                   in_stack_00000198,(uint8_t *)CONCAT44(in_stack_00000194,in_stack_00000190),
                   in_stack_00000ba0,in_stack_00000ba8);
        break;
      default:
        break;
      case '\x06':
        aom_lpf_vertical_6_dual_sse2
                  (in_stack_00000198,in_stack_00000194,in_stack_00000188,
                   (uint8_t *)CONCAT44(in_stack_00000184,in_stack_00000180),in_stack_00000178,
                   in_stack_00000170,in_stack_00001320,in_stack_00001328);
        break;
      case '\b':
        aom_lpf_vertical_8_dual_sse2
                  (in_stack_00000188,in_stack_00000184,in_stack_00000178,in_stack_00000170,
                   (uint8_t *)CONCAT44(in_stack_0000016c,in_stack_00000168),
                   (uint8_t *)CONCAT44(in_stack_00000164,in_stack_00000160),in_stack_00001780,
                   in_stack_00001788);
        break;
      case '\x0e':
        aom_lpf_vertical_14_dual_sse2
                  (in_stack_000002f8,in_stack_000002f4,in_stack_000002e8,in_stack_000002e0,
                   in_stack_000002d8,in_stack_000002d0,in_stack_00002920,in_stack_00002928);
      }
    }
    else {
      switch(*in_RDX) {
      case '\x04':
        aom_lpf_vertical_4_sse2
                  (in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c0,
                   (uint8_t *)in_stack_000000b8);
        break;
      default:
        break;
      case '\x06':
        aom_lpf_vertical_6_sse2
                  (in_stack_00000128,in_stack_00000124,in_stack_00000118,
                   (uchar *)CONCAT44(in_stack_00000114,in_stack_00000110),in_stack_00000108);
        break;
      case '\b':
        aom_lpf_vertical_8_sse2
                  ((uchar *)CONCAT44(in_stack_0000016c,in_stack_00000168),in_stack_00000164,
                   in_stack_00000158,in_stack_00000150,(uchar *)in_stack_00000148);
        break;
      case '\x0e':
        aom_lpf_vertical_14_sse2
                  (in_stack_00000170,in_stack_0000016c,
                   (uchar *)CONCAT44(in_stack_00000164,in_stack_00000160),in_stack_00000158,
                   in_stack_00000150);
      }
    }
  }
  else {
    puVar2 = (uint16_t *)((long)in_RDI * 2);
    if (in_R8B == '\x02') {
      switch(*in_RDX) {
      case '\x04':
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar2 + (in_ESI << 3),in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,
                   puVar1 + 0x10,puVar1 + 0x20,iVar3);
        break;
      default:
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_dual_sse2
                  ((uint16_t *)CONCAT44(in_stack_0000016c,in_stack_00000168),in_stack_00000164,
                   in_stack_00000158,in_stack_00000150,(uint8_t *)in_stack_00000148,
                   (uint8_t *)CONCAT44(in_stack_00000144,in_stack_00000140),in_stack_000010f0,
                   in_stack_000010f8,in_stack_00001100);
        aom_highbd_lpf_vertical_6_dual_sse2
                  ((uint16_t *)CONCAT44(in_stack_0000016c,in_stack_00000168),in_stack_00000164,
                   in_stack_00000158,in_stack_00000150,(uint8_t *)in_stack_00000148,
                   (uint8_t *)CONCAT44(in_stack_00000144,in_stack_00000140),in_stack_000010f0,
                   in_stack_000010f8,in_stack_00001100);
        break;
      case '\b':
        (*aom_highbd_lpf_vertical_8_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
        (*aom_highbd_lpf_vertical_8_dual)
                  (puVar2 + (in_ESI << 3),in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,
                   puVar1 + 0x10,puVar1 + 0x20,iVar3);
        break;
      case '\x0e':
        (*aom_highbd_lpf_vertical_14_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
        (*aom_highbd_lpf_vertical_14_dual)
                  (puVar2 + (in_ESI << 3),in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,
                   puVar1 + 0x10,puVar1 + 0x20,iVar3);
      }
    }
    else if (in_R8B == '\x01') {
      switch(*in_RDX) {
      case '\x04':
        (*aom_highbd_lpf_vertical_4_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
        break;
      default:
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_dual_sse2
                  ((uint16_t *)CONCAT44(in_stack_0000016c,in_stack_00000168),in_stack_00000164,
                   in_stack_00000158,in_stack_00000150,(uint8_t *)in_stack_00000148,
                   (uint8_t *)CONCAT44(in_stack_00000144,in_stack_00000140),in_stack_000010f0,
                   in_stack_000010f8,in_stack_00001100);
        break;
      case '\b':
        (*aom_highbd_lpf_vertical_8_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
        break;
      case '\x0e':
        (*aom_highbd_lpf_vertical_14_dual)
                  (puVar2,in_ESI,puVar1,puVar1 + 0x10,puVar1 + 0x20,puVar1,puVar1 + 0x10,
                   puVar1 + 0x20,iVar3);
      }
    }
    else {
      switch(*in_RDX) {
      case '\x04':
        aom_highbd_lpf_vertical_4_sse2
                  (in_stack_000000b8,in_stack_000000b4,in_stack_000000a8,in_stack_000000a0,
                   in_stack_00000098,in_stack_00000094);
        break;
      default:
        break;
      case '\x06':
        aom_highbd_lpf_vertical_6_sse2
                  (in_stack_00000148,in_stack_00000144,(uint8_t *)in_stack_00000138,
                   (uint8_t *)CONCAT44(in_stack_00000134,in_stack_00000130),in_stack_00000128,
                   in_stack_00000124);
        break;
      case '\b':
        aom_highbd_lpf_vertical_8_sse2
                  (in_stack_00000138,in_stack_00000134,in_stack_00000128,
                   (uint8_t *)CONCAT44(in_stack_00000124,in_stack_00000120),in_stack_00000118,
                   in_stack_00000114);
        break;
      case '\x0e':
        aom_highbd_lpf_vertical_14_sse2
                  (in_stack_00000260,in_stack_0000025c,in_stack_00000250,in_stack_00000248,
                   in_stack_00000240,in_stack_0000023c);
      }
    }
  }
  return;
}

Assistant:

static inline void filter_vert(uint8_t *dst, int dst_stride,
                               const AV1_DEBLOCKING_PARAMETERS *params,
                               const SequenceHeader *seq_params,
                               USE_FILTER_TYPE use_filter_type) {
  const loop_filter_thresh *limits = params->lfthr;
#if CONFIG_AV1_HIGHBITDEPTH
  const int use_highbitdepth = seq_params->use_highbitdepth;
  const aom_bit_depth_t bit_depth = seq_params->bit_depth;
  if (use_highbitdepth) {
    uint16_t *dst_shortptr = CONVERT_TO_SHORTPTR(dst);
    if (use_filter_type == USE_QUAD) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_vertical_4_dual(
              dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              limits->mblim, limits->lim, limits->hev_thr, limits->mblim,
              limits->lim, limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_vertical_6_dual(
              dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              limits->mblim, limits->lim, limits->hev_thr, limits->mblim,
              limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_vertical_8_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_vertical_8_dual(
              dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              limits->mblim, limits->lim, limits->hev_thr, limits->mblim,
              limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_vertical_14_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          aom_highbd_lpf_vertical_14_dual(
              dst_shortptr + (2 * MI_SIZE * dst_stride), dst_stride,
              limits->mblim, limits->lim, limits->hev_thr, limits->mblim,
              limits->lim, limits->hev_thr, bit_depth);
          break;
        // no filtering
        default: break;
      }
    } else if (use_filter_type == USE_DUAL) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_vertical_8_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_vertical_14_dual(
              dst_shortptr, dst_stride, limits->mblim, limits->lim,
              limits->hev_thr, limits->mblim, limits->lim, limits->hev_thr,
              bit_depth);
          break;
        // no filtering
        default: break;
      }
    } else {
      assert(use_filter_type == USE_SINGLE);
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_vertical_4(dst_shortptr, dst_stride, limits->mblim,
                                    limits->lim, limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_vertical_6(dst_shortptr, dst_stride, limits->mblim,
                                    limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 8-tap filtering
        case 8:
          aom_highbd_lpf_vertical_8(dst_shortptr, dst_stride, limits->mblim,
                                    limits->lim, limits->hev_thr, bit_depth);
          break;
        // apply 14-tap filtering
        case 14:
          aom_highbd_lpf_vertical_14(dst_shortptr, dst_stride, limits->mblim,
                                     limits->lim, limits->hev_thr, bit_depth);
          break;
        // no filtering
        default: break;
      }
    }
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  if (use_filter_type == USE_QUAD) {
    // Only one set of loop filter parameters (mblim, lim and hev_thr) is
    // passed as argument to quad loop filter because quad loop filter is
    // called for those cases where all the 4 set of loop filter parameters
    // are equal.
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4_quad(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6_quad(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_vertical_8_quad(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_vertical_14_quad(dst, dst_stride, limits->mblim, limits->lim,
                                 limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  } else if (use_filter_type == USE_DUAL) {
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4_dual(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6_dual(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_vertical_8_dual(dst, dst_stride, limits->mblim, limits->lim,
                                limits->hev_thr, limits->mblim, limits->lim,
                                limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_vertical_14_dual(dst, dst_stride, limits->mblim, limits->lim,
                                 limits->hev_thr, limits->mblim, limits->lim,
                                 limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  } else {
    assert(use_filter_type == USE_SINGLE);
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_vertical_4(dst, dst_stride, limits->mblim, limits->lim,
                           limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_vertical_6(dst, dst_stride, limits->mblim, limits->lim,
                           limits->hev_thr);
        break;
      // apply 8-tap filtering
      case 8:
        aom_lpf_vertical_8(dst, dst_stride, limits->mblim, limits->lim,
                           limits->hev_thr);
        break;
      // apply 14-tap filtering
      case 14:
        aom_lpf_vertical_14(dst, dst_stride, limits->mblim, limits->lim,
                            limits->hev_thr);
        break;
      // no filtering
      default: break;
    }
  }
#if !CONFIG_AV1_HIGHBITDEPTH
  (void)seq_params;
#endif  // !CONFIG_AV1_HIGHBITDEPTH
}